

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

int mbedtls_x509_crl_parse_der(mbedtls_x509_crl *chain,uchar *buf,size_t buflen)

{
  int iVar1;
  mbedtls_x509_crl *pmVar2;
  uchar *puVar3;
  bool bVar4;
  mbedtls_x509_crl *local_98;
  mbedtls_x509_crl *crl;
  mbedtls_x509_buf sig_oid2;
  mbedtls_x509_buf sig_params2;
  mbedtls_x509_buf sig_params1;
  uchar *end;
  uchar *p;
  size_t len;
  size_t sStack_28;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_crl *chain_local;
  
  if ((chain == (mbedtls_x509_crl *)0x0) || (buf == (uchar *)0x0)) {
    chain_local._4_4_ = -0x2800;
  }
  else {
    sStack_28 = buflen;
    buflen_local = (size_t)buf;
    buf_local = (uchar *)chain;
    memset(&sig_params2.p,0,0x18);
    memset(&sig_oid2.p,0,0x18);
    memset(&crl,0,0x18);
    local_98 = chain;
    while( true ) {
      bVar4 = false;
      if (local_98->version != 0) {
        bVar4 = local_98->next != (mbedtls_x509_crl *)0x0;
      }
      if (!bVar4) break;
      local_98 = local_98->next;
    }
    if ((local_98->version != 0) && (local_98->next == (mbedtls_x509_crl *)0x0)) {
      pmVar2 = (mbedtls_x509_crl *)calloc(1,0x1a0);
      local_98->next = pmVar2;
      if (local_98->next == (mbedtls_x509_crl *)0x0) {
        mbedtls_x509_crl_free(local_98);
        return -0x2880;
      }
      mbedtls_x509_crl_init(local_98->next);
      local_98 = local_98->next;
    }
    end = (uchar *)calloc(1,sStack_28);
    if (end == (uchar *)0x0) {
      chain_local._4_4_ = -0x2880;
    }
    else {
      memcpy(end,(void *)buflen_local,sStack_28);
      (local_98->raw).p = end;
      (local_98->raw).len = sStack_28;
      puVar3 = end + sStack_28;
      len._4_4_ = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&p,0x30);
      if (len._4_4_ == 0) {
        if (p == puVar3 + -(long)end) {
          (local_98->tbs).p = end;
          len._4_4_ = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&p,0x30);
          if (len._4_4_ == 0) {
            puVar3 = end + (long)p;
            (local_98->tbs).len = (long)puVar3 - (long)(local_98->tbs).p;
            len._4_4_ = x509_crl_get_version(&end,puVar3,&local_98->version);
            if ((len._4_4_ == 0) &&
               (len._4_4_ = mbedtls_x509_get_alg
                                      (&end,puVar3,&local_98->sig_oid,
                                       (mbedtls_x509_buf *)&sig_params2.p), len._4_4_ == 0)) {
              local_98->version = local_98->version + 1;
              if (local_98->version < 3) {
                len._4_4_ = mbedtls_x509_get_sig_alg
                                      (&local_98->sig_oid,(mbedtls_x509_buf *)&sig_params2.p,
                                       &local_98->sig_md,&local_98->sig_pk,&local_98->sig_opts);
                if (len._4_4_ == 0) {
                  (local_98->issuer_raw).p = end;
                  len._4_4_ = mbedtls_asn1_get_tag(&end,puVar3,(size_t *)&p,0x30);
                  if (len._4_4_ == 0) {
                    len._4_4_ = mbedtls_x509_get_name(&end,end + (long)p,&local_98->issuer);
                    if (len._4_4_ == 0) {
                      (local_98->issuer_raw).len = (long)end - (long)(local_98->issuer_raw).p;
                      len._4_4_ = mbedtls_x509_get_time(&end,puVar3,&local_98->this_update);
                      if (len._4_4_ == 0) {
                        len._4_4_ = mbedtls_x509_get_time(&end,puVar3,&local_98->next_update);
                        if (((len._4_4_ == 0) || (len._4_4_ == -0x2462)) || (len._4_4_ == -0x2460))
                        {
                          len._4_4_ = x509_get_entries(&end,puVar3,&local_98->entry);
                          if (len._4_4_ == 0) {
                            if ((local_98->version == 2) &&
                               (len._4_4_ = x509_get_crl_ext(&end,puVar3,&local_98->crl_ext),
                               len._4_4_ != 0)) {
                              mbedtls_x509_crl_free(local_98);
                              chain_local._4_4_ = len._4_4_;
                            }
                            else {
                              len._4_4_ = 0;
                              if (end == puVar3) {
                                puVar3 = (local_98->raw).p + (local_98->raw).len;
                                len._4_4_ = mbedtls_x509_get_alg
                                                      (&end,puVar3,(mbedtls_x509_buf *)&crl,
                                                       (mbedtls_x509_buf *)&sig_oid2.p);
                                if (len._4_4_ == 0) {
                                  if ((((local_98->sig_oid).len == sig_oid2._0_8_) &&
                                      (iVar1 = memcmp((local_98->sig_oid).p,(void *)sig_oid2.len,
                                                      (local_98->sig_oid).len), iVar1 == 0)) &&
                                     ((sig_params1._0_8_ == sig_params2._0_8_ &&
                                      ((sig_params1._0_8_ == 0 ||
                                       (iVar1 = memcmp((void *)sig_params1.len,
                                                       (void *)sig_params2.len,sig_params1._0_8_),
                                       iVar1 == 0)))))) {
                                    len._4_4_ = mbedtls_x509_get_sig(&end,puVar3,&local_98->sig);
                                    if (len._4_4_ == 0) {
                                      if (end == puVar3) {
                                        chain_local._4_4_ = 0;
                                      }
                                      else {
                                        mbedtls_x509_crl_free(local_98);
                                        chain_local._4_4_ = -0x21e6;
                                      }
                                    }
                                    else {
                                      mbedtls_x509_crl_free(local_98);
                                      chain_local._4_4_ = len._4_4_;
                                    }
                                  }
                                  else {
                                    mbedtls_x509_crl_free(local_98);
                                    chain_local._4_4_ = -0x2680;
                                  }
                                }
                                else {
                                  mbedtls_x509_crl_free(local_98);
                                  chain_local._4_4_ = len._4_4_;
                                }
                              }
                              else {
                                mbedtls_x509_crl_free(local_98);
                                chain_local._4_4_ = -0x21e6;
                              }
                            }
                          }
                          else {
                            mbedtls_x509_crl_free(local_98);
                            chain_local._4_4_ = len._4_4_;
                          }
                        }
                        else {
                          mbedtls_x509_crl_free(local_98);
                          chain_local._4_4_ = len._4_4_;
                        }
                      }
                      else {
                        mbedtls_x509_crl_free(local_98);
                        chain_local._4_4_ = len._4_4_;
                      }
                    }
                    else {
                      mbedtls_x509_crl_free(local_98);
                      chain_local._4_4_ = len._4_4_;
                    }
                  }
                  else {
                    mbedtls_x509_crl_free(local_98);
                    chain_local._4_4_ = len._4_4_ + -0x2180;
                  }
                }
                else {
                  mbedtls_x509_crl_free(local_98);
                  chain_local._4_4_ = -0x2600;
                }
              }
              else {
                mbedtls_x509_crl_free(local_98);
                chain_local._4_4_ = -0x2580;
              }
            }
            else {
              mbedtls_x509_crl_free(local_98);
              chain_local._4_4_ = len._4_4_;
            }
          }
          else {
            mbedtls_x509_crl_free(local_98);
            chain_local._4_4_ = len._4_4_ + -0x2180;
          }
        }
        else {
          mbedtls_x509_crl_free(local_98);
          chain_local._4_4_ = -0x21e6;
        }
      }
      else {
        mbedtls_x509_crl_free(local_98);
        chain_local._4_4_ = -0x2180;
      }
    }
  }
  return chain_local._4_4_;
}

Assistant:

int mbedtls_x509_crl_parse_der( mbedtls_x509_crl *chain,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
    mbedtls_x509_buf sig_params1, sig_params2, sig_oid2;
    mbedtls_x509_crl *crl = chain;

    /*
     * Check for valid input
     */
    if( crl == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    memset( &sig_params1, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_params2, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_oid2, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Add new CRL on the end of the chain if needed.
     */
    while( crl->version != 0 && crl->next != NULL )
        crl = crl->next;

    if( crl->version != 0 && crl->next == NULL )
    {
        crl->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) );

        if( crl->next == NULL )
        {
            mbedtls_x509_crl_free( crl );
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );
        }

        mbedtls_x509_crl_init( crl->next );
        crl = crl->next;
    }

    /*
     * Copy raw DER-encoded CRL
     */
    if( ( p = mbedtls_calloc( 1, buflen ) ) == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    crl->raw.p = p;
    crl->raw.len = buflen;

    end = p + buflen;

    /*
     * CertificateList  ::=  SEQUENCE  {
     *      tbsCertList          TBSCertList,
     *      signatureAlgorithm   AlgorithmIdentifier,
     *      signatureValue       BIT STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     * TBSCertList  ::=  SEQUENCE  {
     */
    crl->tbs.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    crl->tbs.len = end - crl->tbs.p;

    /*
     * Version  ::=  INTEGER  OPTIONAL {  v1(0), v2(1)  }
     *               -- if present, MUST be v2
     *
     * signature            AlgorithmIdentifier
     */
    if( ( ret = x509_crl_get_version( &p, end, &crl->version ) ) != 0 ||
        ( ret = mbedtls_x509_get_alg( &p, end, &crl->sig_oid, &sig_params1 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->version++;

    if( crl->version > 2 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    if( ( ret = mbedtls_x509_get_sig_alg( &crl->sig_oid, &sig_params1,
                                  &crl->sig_md, &crl->sig_pk,
                                  &crl->sig_opts ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    /*
     * issuer               Name
     */
    crl->issuer_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &crl->issuer ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->issuer_raw.len = p - crl->issuer_raw.p;

    /*
     * thisUpdate          Time
     * nextUpdate          Time OPTIONAL
     */
    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->this_update ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->next_update ) ) != 0 )
    {
        if( ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) &&
            ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_OUT_OF_DATA ) )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    /*
     * revokedCertificates    SEQUENCE OF SEQUENCE   {
     *      userCertificate        CertificateSerialNumber,
     *      revocationDate         Time,
     *      crlEntryExtensions     Extensions OPTIONAL
     *                                   -- if present, MUST be v2
     *                        } OPTIONAL
     */
    if( ( ret = x509_get_entries( &p, end, &crl->entry ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    /*
     * crlExtensions          EXPLICIT Extensions OPTIONAL
     *                              -- if present, MUST be v2
     */
    if( crl->version == 2 )
    {
        ret = x509_get_crl_ext( &p, end, &crl->crl_ext );

        if( ret != 0 )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    end = crl->raw.p + crl->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signatureValue       BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &sig_oid2, &sig_params2 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->sig_oid.len != sig_oid2.len ||
        memcmp( crl->sig_oid.p, sig_oid2.p, crl->sig_oid.len ) != 0 ||
        sig_params1.len != sig_params2.len ||
        ( sig_params1.len != 0 &&
          memcmp( sig_params1.p, sig_params2.p, sig_params1.len ) != 0 ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_SIG_MISMATCH );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &crl->sig ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}